

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O1

void __thiscall
btCollisionShape::calculateTemporalAabb
          (btCollisionShape *this,btTransform *curTrans,btVector3 *linvel,btVector3 *angvel,
          btScalar timeStep,btVector3 *temporalAabbMin,btVector3 *temporalAabbMax)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Da;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  (*this->_vptr_btCollisionShape[2])(this,curTrans,temporalAabbMin,temporalAabbMax);
  fVar10 = temporalAabbMax->m_floats[2];
  fVar1 = temporalAabbMin->m_floats[2];
  fVar4 = linvel->m_floats[2] * timeStep;
  if (0.0 < fVar4) {
    fVar10 = fVar10 + fVar4;
  }
  fVar5 = angvel->m_floats[2] * angvel->m_floats[2] +
          angvel->m_floats[0] * angvel->m_floats[0] + angvel->m_floats[1] * angvel->m_floats[1];
  fVar8 = timeStep * (float)*(undefined8 *)linvel->m_floats;
  fVar9 = timeStep * (float)((ulong)*(undefined8 *)linvel->m_floats >> 0x20);
  uVar2 = -(uint)(0.0 < fVar8);
  uVar3 = -(uint)(0.0 < fVar9);
  fVar11 = (float)*(undefined8 *)temporalAabbMin->m_floats;
  fVar12 = (float)((ulong)*(undefined8 *)temporalAabbMin->m_floats >> 0x20);
  fVar6 = (float)*(undefined8 *)temporalAabbMax->m_floats;
  fVar7 = (float)((ulong)*(undefined8 *)temporalAabbMax->m_floats >> 0x20);
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  (*this->_vptr_btCollisionShape[4])(this);
  fVar5 = extraout_XMM0_Da * fVar5 * timeStep;
  *(ulong *)temporalAabbMin->m_floats =
       CONCAT44((uint)fVar12 & uVar3 | ~uVar3 & (uint)(fVar12 + fVar9),
                (uint)fVar11 & uVar2 | ~uVar2 & (uint)(fVar11 + fVar8));
  temporalAabbMin->m_floats[2] =
       (btScalar)
       (-(uint)(0.0 < fVar4) & (uint)fVar1 | ~-(uint)(0.0 < fVar4) & (uint)(fVar1 + fVar4));
  temporalAabbMin->m_floats[3] = 0.0;
  *(ulong *)temporalAabbMax->m_floats =
       CONCAT44(~uVar3 & (uint)fVar7 | (uint)(fVar9 + fVar7) & uVar3,
                ~uVar2 & (uint)fVar6 | (uint)(fVar8 + fVar6) & uVar2);
  temporalAabbMax->m_floats[2] = fVar10;
  temporalAabbMax->m_floats[3] = 0.0;
  *(ulong *)temporalAabbMin->m_floats =
       CONCAT44((float)((ulong)*(undefined8 *)temporalAabbMin->m_floats >> 0x20) - fVar5,
                (float)*(undefined8 *)temporalAabbMin->m_floats - fVar5);
  temporalAabbMin->m_floats[2] = temporalAabbMin->m_floats[2] - fVar5;
  *(ulong *)temporalAabbMax->m_floats =
       CONCAT44((float)((ulong)*(undefined8 *)temporalAabbMax->m_floats >> 0x20) + fVar5,
                (float)*(undefined8 *)temporalAabbMax->m_floats + fVar5);
  temporalAabbMax->m_floats[2] = fVar5 + temporalAabbMax->m_floats[2];
  return;
}

Assistant:

void btCollisionShape::calculateTemporalAabb(const btTransform& curTrans,const btVector3& linvel,const btVector3& angvel,btScalar timeStep, btVector3& temporalAabbMin,btVector3& temporalAabbMax) const
{
	//start with static aabb
	getAabb(curTrans,temporalAabbMin,temporalAabbMax);

	btScalar temporalAabbMaxx = temporalAabbMax.getX();
	btScalar temporalAabbMaxy = temporalAabbMax.getY();
	btScalar temporalAabbMaxz = temporalAabbMax.getZ();
	btScalar temporalAabbMinx = temporalAabbMin.getX();
	btScalar temporalAabbMiny = temporalAabbMin.getY();
	btScalar temporalAabbMinz = temporalAabbMin.getZ();

	// add linear motion
	btVector3 linMotion = linvel*timeStep;
	///@todo: simd would have a vector max/min operation, instead of per-element access
	if (linMotion.x() > btScalar(0.))
		temporalAabbMaxx += linMotion.x(); 
	else
		temporalAabbMinx += linMotion.x();
	if (linMotion.y() > btScalar(0.))
		temporalAabbMaxy += linMotion.y(); 
	else
		temporalAabbMiny += linMotion.y();
	if (linMotion.z() > btScalar(0.))
		temporalAabbMaxz += linMotion.z(); 
	else
		temporalAabbMinz += linMotion.z();

	//add conservative angular motion
	btScalar angularMotion = angvel.length() * getAngularMotionDisc() * timeStep;
	btVector3 angularMotion3d(angularMotion,angularMotion,angularMotion);
	temporalAabbMin = btVector3(temporalAabbMinx,temporalAabbMiny,temporalAabbMinz);
	temporalAabbMax = btVector3(temporalAabbMaxx,temporalAabbMaxy,temporalAabbMaxz);

	temporalAabbMin -= angularMotion3d;
	temporalAabbMax += angularMotion3d;
}